

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O1

void __thiscall
dxil_spv::Converter::Impl::repack_sparse_feedback
          (Impl *this,ComponentType component_type,uint num_components,Value *value,
          Type *target_type,Id override_value)

{
  ComponentType element_type;
  Value *value_00;
  Id IVar1;
  Id type_id;
  Builder *this_00;
  Operation *pOVar2;
  Type *type;
  long lVar3;
  undefined7 in_register_00000031;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  Id components [5];
  ComponentType local_65;
  Id local_64;
  Value *local_60;
  Type *local_58;
  Operation *local_50;
  Id aIStack_48 [6];
  
  local_65 = component_type;
  local_58 = target_type;
  this_00 = SPIRVModule::get_builder(this->spirv_module);
  IVar1 = spv::Builder::makeIntegerType(this_00,0x20,false);
  pOVar2 = allocate(this,OpCompositeExtract,IVar1);
  local_60 = value;
  IVar1 = get_id_for_value(this,value,0);
  Operation::add_id(pOVar2,IVar1);
  Operation::add_literal(pOVar2,0);
  local_50 = pOVar2;
  add(this,pOVar2,false);
  iVar4 = (int)CONCAT71(in_register_00000031,component_type);
  if (iVar4 == 8) {
    component_type = F32;
  }
  else if (iVar4 == 3) {
    component_type = U32;
  }
  else if (iVar4 == 2) {
    component_type = I32;
  }
  if (override_value == 0) {
    IVar1 = get_type_id(this,component_type,1,num_components,false);
    pOVar2 = allocate(this,OpCompositeExtract,IVar1);
    IVar1 = get_id_for_value(this,local_60,0);
    Operation::add_id(pOVar2,IVar1);
    Operation::add_literal(pOVar2,1);
    add(this,pOVar2,false);
    override_value = pOVar2->id;
  }
  local_64 = override_value;
  fixup_load_type_typed(this,&local_65,num_components,&local_64,local_58);
  IVar1 = local_64;
  element_type = local_65;
  if (num_components < 2) {
    lVar3 = 0;
    do {
      *(Id *)((long)aIStack_48 + lVar3) = local_64;
      lVar3 = lVar3 + 4;
    } while (lVar3 != 0x14);
    uVar6 = 4;
  }
  else {
    uVar6 = (ulong)num_components;
    uVar5 = 0;
    do {
      type_id = get_type_id(this,element_type,1,1,false);
      pOVar2 = allocate(this,OpCompositeExtract,type_id);
      Operation::add_id(pOVar2,IVar1);
      Operation::add_literal(pOVar2,(uint32_t)uVar5);
      add(this,pOVar2,false);
      aIStack_48[uVar5] = pOVar2->id;
      uVar5 = uVar5 + 1;
    } while (uVar6 != uVar5);
  }
  value_00 = local_60;
  aIStack_48[uVar6] = local_50->id;
  type = LLVMBC::Value::getType(local_60);
  lVar3 = 0;
  IVar1 = get_type_id(this,type,0);
  pOVar2 = allocate(this,OpCompositeConstruct,IVar1);
  do {
    Operation::add_id(pOVar2,*(Id *)((long)aIStack_48 + lVar3));
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x14);
  add(this,pOVar2,false);
  rewrite_value(this,value_00,pOVar2->id);
  return;
}

Assistant:

void Converter::Impl::repack_sparse_feedback(DXIL::ComponentType component_type, unsigned num_components, const llvm::Value *value,
                                             const llvm::Type *target_type, spv::Id override_value)
{
	auto *code_id = allocate(spv::OpCompositeExtract, builder().makeUintType(32));
	code_id->add_id(get_id_for_value(value));
	code_id->add_literal(0);
	add(code_id);

	auto effective_component_type = get_effective_typed_resource_type(component_type);
	spv::Id texel_id;

	if (override_value)
	{
		texel_id = override_value;
	}
	else
	{
		auto *texel = allocate(spv::OpCompositeExtract, get_type_id(effective_component_type, 1, num_components));
		texel->add_id(get_id_for_value(value));
		texel->add_literal(1);
		add(texel);
		texel_id = texel->id;
	}

	fixup_load_type_typed(component_type, num_components, texel_id, target_type);

	spv::Id components[5];

	if (num_components > 1)
	{
		for (unsigned i = 0; i < num_components; i++)
		{
			auto *extract_op = allocate(spv::OpCompositeExtract, get_type_id(component_type, 1, 1));
			extract_op->add_id(texel_id);
			extract_op->add_literal(i);
			add(extract_op);
			components[i] = extract_op->id;
		}
	}
	else
	{
		for (auto &comp : components)
			comp = texel_id;
		num_components = 4;
	}

	components[num_components] = code_id->id;

	auto *repack_op = allocate(spv::OpCompositeConstruct, get_type_id(value->getType()));
	for (auto &comp : components)
		repack_op->add_id(comp);
	add(repack_op);
	rewrite_value(value, repack_op->id);
}